

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::pluralise(lest *this,text *word,int n)

{
  int n_local;
  text *word_local;
  
  if (n == 1) {
    std::__cxx11::string::string((string *)this,(string *)word);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)word);
  }
  return this;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}